

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O2

bool * Eigen::internal::conditional_aligned_new_auto<bool,true>(size_t size)

{
  bool *pbVar1;
  
  if (size == 0) {
    return (bool *)0x0;
  }
  pbVar1 = (bool *)malloc(size);
  if (size < 0x10 || ((ulong)pbVar1 & 0xf) == 0) {
    if (size != 0 && pbVar1 == (bool *)0x0) {
      throw_std_bad_alloc();
    }
    return pbVar1;
  }
  __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
}

Assistant:

EIGEN_DEVICE_FUNC inline T* conditional_aligned_new_auto(std::size_t size)
{
  if(size==0)
    return 0; // short-cut. Also fixes Bug 884
  check_size_for_overflow<T>(size);
  T *result = reinterpret_cast<T*>(conditional_aligned_malloc<Align>(sizeof(T)*size));
  if(NumTraits<T>::RequireInitialization)
  {
    EIGEN_TRY
    {
      construct_elements_of_array(result, size);
    }
    EIGEN_CATCH(...)
    {
      conditional_aligned_free<Align>(result);
      EIGEN_THROW;
    }
  }